

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionWrapper.cpp
# Opt level: O0

Statement * __thiscall
IRT::ExpressionWrapper::ToConditional(ExpressionWrapper *this,Label *true_label,Label *false_label)

{
  Expression *left;
  JumpConditionalStatement *this_00;
  ConstExpression *this_01;
  Label local_70;
  Label local_50;
  Label *local_20;
  Label *false_label_local;
  Label *true_label_local;
  ExpressionWrapper *this_local;
  
  local_20 = false_label;
  false_label_local = true_label;
  true_label_local = (Label *)this;
  this_00 = (JumpConditionalStatement *)operator_new(0x60);
  left = this->expression_;
  this_01 = (ConstExpression *)operator_new(0x10);
  ConstExpression::ConstExpression(this_01,0);
  Label::Label(&local_50,true_label);
  Label::Label(&local_70,false_label);
  JumpConditionalStatement::JumpConditionalStatement
            (this_00,NE,left,(Expression *)this_01,&local_50,&local_70);
  Label::~Label(&local_70);
  Label::~Label(&local_50);
  return &this_00->super_Statement;
}

Assistant:

IRT::Statement *IRT::ExpressionWrapper::ToConditional(IRT::Label true_label, IRT::Label false_label) {
    return new JumpConditionalStatement(
          LogicOperatorType::NE,
          expression_,
          new ConstExpression(0),
          true_label,
          false_label
    );
}